

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

size_t __thiscall OpenMesh::PropertyT<float>::size_of(PropertyT<float> *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  const_iterator cVar2;
  const_iterator cVar3;
  PropertyT<float> *this_local;
  
  iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xc])();
  if (CONCAT44(extraout_var,iVar1) == -1) {
    cVar2 = std::vector<float,_std::allocator<float>_>::begin(&this->data_);
    cVar3 = std::vector<float,_std::allocator<float>_>::end(&this->data_);
    this_local = (PropertyT<float> *)
                 std::
                 accumulate<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,unsigned_long,OpenMesh::PropertyT<float>::plus>
                           (cVar2._M_current,cVar3._M_current,0);
  }
  else {
    iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])();
    this_local = (PropertyT<float> *)
                 BaseProperty::size_of(&this->super_BaseProperty,CONCAT44(extraout_var_00,iVar1));
  }
  return (size_t)this_local;
}

Assistant:

virtual size_t size_of(void) const
  {
    if (element_size() != IO::UnknownSize)
      return this->BaseProperty::size_of(n_elements());
    return std::accumulate(data_.begin(), data_.end(), size_t(0), plus());
  }